

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_address.cpp
# Opt level: O0

int CfdAddMultisigScriptData(void *handle,void *multisig_handle,char *pubkey)

{
  undefined8 uVar1;
  CfdException *this;
  char *in_RDX;
  long in_RSI;
  CfdException *except;
  exception *std_except;
  string pubkey_str;
  Pubkey key;
  CfdCapiMultisigScript *data;
  string *in_stack_fffffffffffffe70;
  undefined8 in_stack_fffffffffffffe78;
  CfdError error_code;
  allocator *paVar2;
  CfdException *in_stack_fffffffffffffe80;
  string local_140;
  allocator local_119;
  string local_118;
  Pubkey local_f8;
  undefined1 local_da;
  allocator local_d9;
  string local_d8 [32];
  CfdSourceLocation local_b8;
  long local_a0;
  undefined6 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6e;
  allocator in_stack_ffffffffffffff6f;
  void *in_stack_ffffffffffffff70;
  CfdSourceLocation local_70;
  allocator local_51;
  string local_50 [48];
  char *local_20;
  long local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffe78 >> 0x20);
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"MultisigScript",&local_51);
  cfd::capi::CheckBuffer
            (in_stack_ffffffffffffff70,
             (string *)
             CONCAT17(in_stack_ffffffffffffff6f,
                      CONCAT16(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68)));
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  if (local_20 == (char *)0x0) {
    local_70.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_address.cpp"
                 ,0x2f);
    local_70.filename = local_70.filename + 1;
    local_70.line = 0x107;
    local_70.funcname = "CfdAddMultisigScriptData";
    cfd::core::logger::warn<>(&local_70,"pubkey is null.");
    uVar1 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff70,"Failed to parameter. pubkey is null.",
               (allocator *)&stack0xffffffffffffff6f);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffe80,error_code,in_stack_fffffffffffffe70);
    __cxa_throw(uVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_a0 = local_18;
  if (0x13 < *(uint *)(local_18 + 0xa54)) {
    local_b8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_address.cpp"
                 ,0x2f);
    local_b8.filename = local_b8.filename + 1;
    local_b8.line = 0x111;
    local_b8.funcname = "CfdAddMultisigScriptData";
    cfd::core::logger::warn<>(&local_b8,"The number of pubkey has reached the upper limit.");
    local_da = 1;
    this = (CfdException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_d8,"The number of pubkey has reached the upper limit.",&local_d9);
    cfd::core::CfdException::CfdException(this,error_code,in_stack_fffffffffffffe70);
    local_da = 0;
    __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  paVar2 = &local_119;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_118,local_20,paVar2);
  cfd::core::Pubkey::Pubkey(&local_f8,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  cfd::core::Pubkey::GetHex_abi_cxx11_(&local_140,&local_f8);
  std::__cxx11::string::copy
            ((char *)&local_140,local_a0 + 0x18 + (ulong)*(uint *)(local_a0 + 0xa54) * 0x83,0x82);
  *(int *)(local_a0 + 0xa54) = *(int *)(local_a0 + 0xa54) + 1;
  local_4 = 0;
  std::__cxx11::string::~string((string *)&local_140);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x57f6b3);
  return local_4;
}

Assistant:

int CfdAddMultisigScriptData(
    void* handle, void* multisig_handle, const char* pubkey) {
  try {
    cfd::Initialize();
    CheckBuffer(multisig_handle, kPrefixMultisigScript);
    if (pubkey == nullptr) {
      warn(CFD_LOG_SOURCE, "pubkey is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey is null.");
    }

    CfdCapiMultisigScript* data =
        static_cast<CfdCapiMultisigScript*>(multisig_handle);
    if (data->current_index >= kMultisigMaxKeyNum) {
      warn(
          CFD_LOG_SOURCE, "The number of pubkey has reached the upper limit.");
      throw CfdException(
          CfdError::kCfdOutOfRangeError,
          "The number of pubkey has reached the upper limit.");
    }

    Pubkey key = Pubkey(std::string(pubkey));
    std::string pubkey_str = key.GetHex();
    pubkey_str.copy(data->pubkeys[data->current_index], kPubkeyHexSize);
    ++(data->current_index);
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}